

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_statusline(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  curl_trc_feat *pcVar5;
  CURLcode CVar6;
  
  uVar3 = (data->req).httpversion;
  if ((uVar3 & 0xfffffffe) == 10) {
    bVar2 = conn->httpversion;
    if ((byte)(bVar2 - 10) < 10 || bVar2 == 0) {
      iVar4 = (data->req).httpcode;
      (data->info).httpcode = iVar4;
      (data->info).httpversion = uVar3;
      conn->httpversion = (uchar)uVar3;
      bVar2 = (data->state).httpversion;
      if (bVar2 == 0 || (int)uVar3 < (int)(uint)bVar2) {
        (data->state).httpversion = (uchar)uVar3;
      }
      if (((data->state).resume_from != 0) && (iVar4 == 0x1a0 && (data->state).httpreq == '\0')) {
        puVar1 = &(data->req).field_0xda;
        *puVar1 = *puVar1 | 4;
      }
      if (uVar3 == 10) {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar5 = (data->state).feat, pcVar5 == (curl_trc_feat *)0x0 || (0 < pcVar5->log_level))
           )) {
          Curl_infof(data,"HTTP 1.0, assume close after body");
        }
        Curl_conncontrol(conn,1);
      }
      iVar4 = (data->req).httpcode;
      uVar3 = *(uint *)&(data->req).field_0xd9;
      *(uint *)&(data->req).field_0xd9 = uVar3 & 0xfffff7ff | (uint)(iVar4 - 100U < 100) << 0xb;
      CVar6 = CURLE_OK;
      if (iVar4 != 0xcc) {
        if (iVar4 != 0x130) {
          return CURLE_OK;
        }
        if ((data->set).timecondition != '\0') {
          puVar1 = &(data->info).field_0xe4;
          *puVar1 = *puVar1 | 1;
        }
      }
      (data->req).size = 0;
      (data->req).maxdownload = 0;
      *(uint *)&(data->req).field_0xd9 = uVar3 | 0x800;
    }
    else {
      CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
      Curl_failf(data,"Version mismatch (from HTTP/%u to HTTP/%u)",(ulong)(bVar2 / 10),1);
    }
  }
  else {
    Curl_failf(data,"Unsupported HTTP version (%u.%d) in response",(ulong)(uint)((int)uVar3 / 10),
               (ulong)(uint)((int)uVar3 % 10));
    CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_http_statusline(struct Curl_easy *data,
                              struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  switch(k->httpversion) {
  case 10:
  case 11:
#ifdef USE_HTTP2
  case 20:
#endif
#ifdef USE_HTTP3
  case 30:
#endif
    /* no major version switch mid-connection */
    if(conn->httpversion &&
       (k->httpversion/10 != conn->httpversion/10)) {
      failf(data, "Version mismatch (from HTTP/%u to HTTP/%u)",
            conn->httpversion/10, k->httpversion/10);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    break;
  default:
    failf(data, "Unsupported HTTP version (%u.%d) in response",
          k->httpversion/10, k->httpversion%10);
    return CURLE_UNSUPPORTED_PROTOCOL;
  }

  data->info.httpcode = k->httpcode;
  data->info.httpversion = k->httpversion;
  conn->httpversion = (unsigned char)k->httpversion;

  if(!data->state.httpversion || data->state.httpversion > k->httpversion)
    /* store the lowest server version we encounter */
    data->state.httpversion = (unsigned char)k->httpversion;

  /*
   * This code executes as part of processing the header. As a
   * result, it is not totally clear how to interpret the
   * response code yet as that depends on what other headers may
   * be present. 401 and 407 may be errors, but may be OK
   * depending on how authentication is working. Other codes
   * are definitely errors, so give up here.
   */
  if(data->state.resume_from && data->state.httpreq == HTTPREQ_GET &&
     k->httpcode == 416) {
    /* "Requested Range Not Satisfiable", just proceed and
       pretend this is no error */
    k->ignorebody = TRUE; /* Avoid appending error msg to good data. */
  }

  if(k->httpversion == 10) {
    /* Default action for HTTP/1.0 must be to close, unless
       we get one of those fancy headers that tell us the
       server keeps it open for us! */
    infof(data, "HTTP 1.0, assume close after body");
    connclose(conn, "HTTP/1.0 close after body");
  }
  else if(k->httpversion == 20 ||
          (k->upgr101 == UPGR101_H2 && k->httpcode == 101)) {
    DEBUGF(infof(data, "HTTP/2 found, allow multiplexing"));
  }

  k->http_bodyless = k->httpcode >= 100 && k->httpcode < 200;
  switch(k->httpcode) {
  case 304:
    /* (quote from RFC2616, section 10.3.5): The 304 response
     * MUST NOT contain a message-body, and thus is always
     * terminated by the first empty line after the header
     * fields.  */
    if(data->set.timecondition)
      data->info.timecond = TRUE;
    FALLTHROUGH();
  case 204:
    /* (quote from RFC2616, section 10.2.5): The server has
     * fulfilled the request but does not need to return an
     * entity-body ... The 204 response MUST NOT include a
     * message-body, and thus is always terminated by the first
     * empty line after the header fields. */
    k->size = 0;
    k->maxdownload = 0;
    k->http_bodyless = TRUE;
    break;
  default:
    break;
  }
  return CURLE_OK;
}